

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_connection::update_desired_queue_size(peer_connection *this)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  uint uVar7;
  shared_ptr<libtorrent::aux::torrent> t;
  
  if (((this->super_peer_connection_hot_members).field_0x28 & 8) == 0) {
    uVar1 = this->m_desired_queue_size;
    iVar4 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(this);
    uVar3 = *(uint *)(CONCAT44(extraout_var,iVar4) + 0x2c);
    uVar5 = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4006);
    if ((this->field_0x887 & 0x20) == 0) {
      ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->super_peer_connection_hot_members).m_torrent);
      uVar6 = ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length;
      uVar7 = 0x4000;
      if (uVar6 < 0x4000) {
        uVar7 = uVar6;
      }
      if ((int)uVar6 < 1) {
        uVar7 = 0x4000;
      }
      this->m_desired_queue_size = (uint16_t)((int)(uVar5 * uVar3) / (int)uVar7);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    uVar6._0_2_ = this->m_desired_queue_size;
    uVar6._2_2_ = this->m_prefer_contiguous_blocks;
    uVar2 = this->m_max_out_request_queue;
    uVar7 = uVar6;
    if (uVar2 <= (ushort)(undefined2)uVar6) {
      uVar7 = (uint)uVar2;
    }
    if (uVar2 < (ushort)(undefined2)uVar6 || (ushort)uVar7 < 2) {
      uVar6 = 2;
      if (2 < (ushort)uVar7) {
        uVar6 = uVar7;
      }
      this->m_desired_queue_size = (uint16_t)uVar6;
    }
    if (uVar1 != (uint16_t)uVar6) {
      peer_log(this,info,"UPDATE_QUEUE_SIZE",
               "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d",(ulong)(uVar6 & 0xffff),
               (ulong)uVar2,(ulong)uVar3,(ulong)uVar5,
               (ulong)(*(uint *)&(this->super_peer_connection_hot_members).field_0x28 >> 3 & 1),
               (ulong)((byte)this->field_0x887 >> 5 & 1));
    }
  }
  else {
    this->m_desired_queue_size = 1;
  }
  return;
}

Assistant:

void peer_connection::update_desired_queue_size()
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_snubbed)
		{
			m_desired_queue_size = 1;
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		int const previous_queue_size = m_desired_queue_size;
#endif

		int const download_rate = statistics().download_payload_rate();

		// the desired download queue size
		int const queue_time = m_settings.get_int(settings_pack::request_queue_time);

		// when we're in slow-start mode we increase the desired queue size every
		// time we receive a piece, no need to adjust it here (other than
		// enforcing the upper limit)
		if (!m_slow_start)
		{
			// (if the latency is more than this, the download will stall)
			// so, the queue size is queue_time * down_rate / 16 kiB
			// (16 kB is the size of each request)
			// the minimum number of requests is 2 and the maximum is 48
			// the block size doesn't have to be 16. So we first query the
			// torrent for it
			auto t = m_torrent.lock();
			int const bs = t->block_size();

			TORRENT_ASSERT(bs > 0);

			m_desired_queue_size = std::uint16_t(queue_time * download_rate / bs);
		}

		if (m_desired_queue_size > m_max_out_request_queue)
			m_desired_queue_size = m_max_out_request_queue;
		if (m_desired_queue_size < min_request_queue)
			m_desired_queue_size = min_request_queue;

#ifndef TORRENT_DISABLE_LOGGING
		if (previous_queue_size != m_desired_queue_size)
		{
			peer_log(peer_log_alert::info, "UPDATE_QUEUE_SIZE"
				, "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d"
				, int(m_desired_queue_size), int(m_max_out_request_queue)
				, download_rate, queue_time, int(m_snubbed), int(m_slow_start));
		}
#endif
	}